

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

CURLcode mqtt_get_topic(connectdata *conn,char **topic,size_t *topiclen)

{
  char *__s;
  size_t sVar1;
  char *path;
  CURLcode result;
  size_t *topiclen_local;
  char **topic_local;
  connectdata *conn_local;
  
  __s = (conn->data->state).up.path;
  sVar1 = strlen(__s);
  if (sVar1 < 2) {
    Curl_failf(conn->data,"Error: No topic specified.");
    path._4_4_ = CURLE_URL_MALFORMAT;
  }
  else {
    path._4_4_ = Curl_urldecode(conn->data,__s + 1,0,topic,topiclen,REJECT_NADA);
  }
  return path._4_4_;
}

Assistant:

static CURLcode mqtt_get_topic(struct connectdata *conn,
                               char **topic, size_t *topiclen)
{
  CURLcode result = CURLE_OK;
  char *path = conn->data->state.up.path;

  if(strlen(path) > 1) {
    result = Curl_urldecode(conn->data, path + 1, 0, topic, topiclen,
                            REJECT_NADA);
  }
  else {
    failf(conn->data, "Error: No topic specified.");
    result = CURLE_URL_MALFORMAT;
  }
  return result;
}